

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objects.hh
# Opt level: O1

void __thiscall
discordpp::Application::Application
          (Application *this,field<discordpp::Snowflake> *id,
          field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *name,nullable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *icon,
          field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *description,
          omittable_field<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *rpc_origins,field<bool> *bot_public,field<bool> *bot_require_code_grant,
          omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *terms_of_service_url,
          omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *privacy_policy_url,omittable_field<discordpp::User> *owner,
          field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *summary,field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *verify_key,nullable_field<discordpp::Team> *team,
          omittable_field<discordpp::Snowflake> *guild_id,
          omittable_field<discordpp::Snowflake> *primary_sku_id,
          omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *slug,omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *cover_image,omittable_field<int> *flags,
          omittable_field<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *tags,omittable_field<discordpp::InstallParams> *install_params,
          omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *custom_install_url,
          omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *role_connections_verification_url)

{
  _Head_base<0UL,_discordpp::Snowflake_*,_false> _Var1;
  _Head_base<0UL,_bool_*,_false> _Var2;
  _Head_base<0UL,_int_*,_false> _Var3;
  _Head_base<0UL,_discordpp::Snowflake_*,_false> _Var4;
  _Head_base<0UL,_bool_*,_false> _Var5;
  _Head_base<0UL,_int_*,_false> _Var6;
  pointer *__ptr_3;
  pointer *__ptr;
  pointer *__ptr_1;
  pointer *__ptr_2;
  
  _Var1._M_head_impl =
       (id->t_)._M_t.
       super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t.
       super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
       super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl;
  if (_Var1._M_head_impl == (Snowflake *)0x0) {
    (this->id).t_._M_t.
    super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t.
    super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
    super__Head_base<0UL,_discordpp::Snowflake_*,_false> =
         (_Head_base<0UL,_discordpp::Snowflake_*,_false>)0x0;
    _Var4._M_head_impl = (Snowflake *)0x0;
  }
  else {
    _Var4._M_head_impl = (Snowflake *)operator_new(8);
    (_Var4._M_head_impl)->_value = (_Var1._M_head_impl)->_value;
  }
  (this->id).t_._M_t.
  super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t.
  super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
  super__Head_base<0UL,_discordpp::Snowflake_*,_false> =
       (_Head_base<0UL,_discordpp::Snowflake_*,_false>)_Var4._M_head_impl;
  (this->id).s_ = id->s_;
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::field
            (&this->name,name);
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::field
            (&(this->icon).
              super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ,&icon->
               super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            );
  (this->icon)._vptr_nullable_field = (_func_int **)&PTR_operator__0024e100;
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::field
            (&this->description,description);
  field<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::field(&(this->rpc_origins).
           super_field<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ,&rpc_origins->
            super_field<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         );
  (this->rpc_origins)._vptr_omittable_field = (_func_int **)&PTR_operator__0024e6f0;
  _Var2._M_head_impl =
       (bot_public->t_)._M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool>_>._M_t.
       super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.
       super__Head_base<0UL,_bool_*,_false>._M_head_impl;
  if (_Var2._M_head_impl == (bool *)0x0) {
    (this->bot_public).t_._M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool>_>._M_t.
    super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.super__Head_base<0UL,_bool_*,_false>.
    _M_head_impl = (bool *)0x0;
    _Var5._M_head_impl = (bool *)0x0;
  }
  else {
    _Var5._M_head_impl = (bool *)operator_new(1);
    *_Var5._M_head_impl = *_Var2._M_head_impl;
  }
  (this->bot_public).t_._M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool>_>._M_t.
  super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.super__Head_base<0UL,_bool_*,_false>.
  _M_head_impl = _Var5._M_head_impl;
  (this->bot_public).s_ = bot_public->s_;
  _Var2._M_head_impl =
       (bot_require_code_grant->t_)._M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool>_>.
       _M_t.super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.
       super__Head_base<0UL,_bool_*,_false>._M_head_impl;
  if (_Var2._M_head_impl == (bool *)0x0) {
    (this->bot_require_code_grant).t_._M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool>_>.
    _M_t.super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.
    super__Head_base<0UL,_bool_*,_false>._M_head_impl = (bool *)0x0;
    _Var5._M_head_impl = (bool *)0x0;
  }
  else {
    _Var5._M_head_impl = (bool *)operator_new(1);
    *_Var5._M_head_impl = *_Var2._M_head_impl;
  }
  (this->bot_require_code_grant).t_._M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool>_>.
  _M_t.super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.
  super__Head_base<0UL,_bool_*,_false>._M_head_impl = _Var5._M_head_impl;
  (this->bot_require_code_grant).s_ = bot_require_code_grant->s_;
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::field
            (&(this->terms_of_service_url).
              super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ,&terms_of_service_url->
               super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            );
  (this->terms_of_service_url)._vptr_omittable_field = (_func_int **)&PTR_operator__0024e258;
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::field
            (&(this->privacy_policy_url).
              super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ,&privacy_policy_url->
               super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            );
  (this->privacy_policy_url)._vptr_omittable_field = (_func_int **)&PTR_operator__0024e258;
  field<discordpp::User>::field
            (&(this->owner).super_field<discordpp::User>,&owner->super_field<discordpp::User>);
  (this->owner)._vptr_omittable_field = (_func_int **)&PTR_operator__0024e5c0;
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::field
            (&this->summary,summary);
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::field
            (&this->verify_key,verify_key);
  field<discordpp::Team>::field
            (&(this->team).super_field<discordpp::Team>,&team->super_field<discordpp::Team>);
  (this->team)._vptr_nullable_field = (_func_int **)&PTR_operator__0024e740;
  _Var1._M_head_impl =
       (guild_id->super_field<discordpp::Snowflake>).t_._M_t.
       super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t.
       super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
       super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl;
  if (_Var1._M_head_impl == (Snowflake *)0x0) {
    (this->guild_id).super_field<discordpp::Snowflake>.t_._M_t.
    super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t.
    super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
    super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl = (Snowflake *)0x0;
    _Var4._M_head_impl = (Snowflake *)0x0;
  }
  else {
    _Var4._M_head_impl = (Snowflake *)operator_new(8);
    (_Var4._M_head_impl)->_value = (_Var1._M_head_impl)->_value;
  }
  (this->guild_id).super_field<discordpp::Snowflake>.t_._M_t.
  super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t.
  super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
  super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl = _Var4._M_head_impl;
  (this->guild_id).super_field<discordpp::Snowflake>.s_ =
       (guild_id->super_field<discordpp::Snowflake>).s_;
  (this->guild_id)._vptr_omittable_field = (_func_int **)&PTR_operator__0024e4e0;
  _Var1._M_head_impl =
       (primary_sku_id->super_field<discordpp::Snowflake>).t_._M_t.
       super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t.
       super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
       super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl;
  if (_Var1._M_head_impl == (Snowflake *)0x0) {
    (this->primary_sku_id).super_field<discordpp::Snowflake>.t_._M_t.
    super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t.
    super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
    super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl = (Snowflake *)0x0;
    _Var4._M_head_impl = (Snowflake *)0x0;
  }
  else {
    _Var4._M_head_impl = (Snowflake *)operator_new(8);
    (_Var4._M_head_impl)->_value = (_Var1._M_head_impl)->_value;
  }
  (this->primary_sku_id).super_field<discordpp::Snowflake>.t_._M_t.
  super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t.
  super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
  super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl = _Var4._M_head_impl;
  (this->primary_sku_id).super_field<discordpp::Snowflake>.s_ =
       (primary_sku_id->super_field<discordpp::Snowflake>).s_;
  (this->primary_sku_id)._vptr_omittable_field = (_func_int **)&PTR_operator__0024e4e0;
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::field
            (&(this->slug).
              super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ,&slug->
               super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            );
  (this->slug)._vptr_omittable_field = (_func_int **)&PTR_operator__0024e258;
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::field
            (&(this->cover_image).
              super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ,&cover_image->
               super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            );
  (this->cover_image)._vptr_omittable_field = (_func_int **)&PTR_operator__0024e258;
  _Var3._M_head_impl =
       (flags->super_field<int>).t_._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
       super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
       _M_head_impl;
  if (_Var3._M_head_impl == (int *)0x0) {
    (this->flags).super_field<int>.t_._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>.
    _M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
    super__Head_base<0UL,_int_*,_false>._M_head_impl = (int *)0x0;
    _Var6._M_head_impl = (int *)0x0;
  }
  else {
    _Var6._M_head_impl = (int *)operator_new(4);
    *_Var6._M_head_impl = *_Var3._M_head_impl;
  }
  (this->flags).super_field<int>.t_._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = _Var6._M_head_impl;
  (this->flags).super_field<int>.s_ = (flags->super_field<int>).s_;
  (this->flags)._vptr_omittable_field = (_func_int **)&PTR_operator__0024e298;
  field<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::field(&(this->tags).
           super_field<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ,&tags->
            super_field<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         );
  (this->tags)._vptr_omittable_field = (_func_int **)&PTR_operator__0024e6f0;
  field<discordpp::InstallParams>::field
            (&(this->install_params).super_field<discordpp::InstallParams>,
             &install_params->super_field<discordpp::InstallParams>);
  (this->install_params)._vptr_omittable_field = (_func_int **)&PTR_operator__0024e798;
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::field
            (&(this->custom_install_url).
              super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ,&custom_install_url->
               super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            );
  (this->custom_install_url)._vptr_omittable_field = (_func_int **)&PTR_operator__0024e258;
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::field
            (&(this->role_connections_verification_url).
              super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ,&role_connections_verification_url->
               super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            );
  (this->role_connections_verification_url)._vptr_omittable_field =
       (_func_int **)&PTR_operator__0024e258;
  return;
}

Assistant:

Application(
        field<Snowflake> id = uninitialized,
        field<std::string> name = uninitialized,
        nullable_field<std::string> icon = uninitialized,
        field<std::string> description = uninitialized,
        omittable_field<std::vector<std::string> > rpc_origins = omitted,
        field<bool> bot_public = uninitialized,
        field<bool> bot_require_code_grant = uninitialized,
        omittable_field<std::string> terms_of_service_url = omitted,
        omittable_field<std::string> privacy_policy_url = omitted,
        omittable_field<User> owner = omitted,
        field<std::string> summary = uninitialized,
        field<std::string> verify_key = uninitialized,
        nullable_field<Team> team = uninitialized,
        omittable_field<Snowflake> guild_id = omitted,
        omittable_field<Snowflake> primary_sku_id = omitted,
        omittable_field<std::string> slug = omitted,
        omittable_field<std::string> cover_image = omitted,
        omittable_field<int> flags = omitted,
        omittable_field<std::vector<std::string> > tags = omitted,
        omittable_field<InstallParams> install_params = omitted,
        omittable_field<std::string> custom_install_url = omitted,
        omittable_field<std::string> role_connections_verification_url = omitted
    ):
        id(id),
        name(name),
        icon(icon),
        description(description),
        rpc_origins(rpc_origins),
        bot_public(bot_public),
        bot_require_code_grant(bot_require_code_grant),
        terms_of_service_url(terms_of_service_url),
        privacy_policy_url(privacy_policy_url),
        owner(owner),
        summary(summary),
        verify_key(verify_key),
        team(team),
        guild_id(guild_id),
        primary_sku_id(primary_sku_id),
        slug(slug),
        cover_image(cover_image),
        flags(flags),
        tags(tags),
        install_params(install_params),
        custom_install_url(custom_install_url),
        role_connections_verification_url(role_connections_verification_url)
    {}